

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::skipCast
          (OptimizeInstructions *this,Expression **input,Type requiredType)

{
  bool bVar1;
  PassOptions *pPVar2;
  bool local_62;
  bool local_61;
  BasicType local_4c;
  RefCast *local_48;
  RefCast *cast;
  uintptr_t local_38;
  BasicType local_2c;
  RefAs *local_28;
  RefAs *as;
  Expression **input_local;
  OptimizeInstructions *this_local;
  Type requiredType_local;
  
  as = (RefAs *)input;
  input_local = (Expression **)this;
  this_local = (OptimizeInstructions *)requiredType.id;
  pPVar2 = Pass::getPassOptions((Pass *)this);
  if ((pPVar2->trapsNeverHappen & 1U) != 0) {
    while( true ) {
      while (local_28 = Expression::dynCast<wasm::RefAs>
                                  (*(Expression **)
                                    &(as->super_SpecificExpression<(wasm::Expression::Id)81>).
                                     super_Expression), local_28 != (RefAs *)0x0) {
        local_2c = none;
        bVar1 = wasm::Type::operator==((Type *)&this_local,&local_2c);
        local_61 = true;
        if (!bVar1) {
          local_38 = (local_28->value->type).id;
          cast = (RefCast *)this_local;
          local_61 = wasm::Type::isSubType((Type)local_38,(Type)this_local);
        }
        if (local_61 == false) {
          return;
        }
        *(Expression **)&(as->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression =
             local_28->value;
      }
      local_48 = Expression::dynCast<wasm::RefCast>
                           (*(Expression **)
                             &(as->super_SpecificExpression<(wasm::Expression::Id)81>).
                              super_Expression);
      if (local_48 == (RefCast *)0x0) break;
      local_4c = none;
      bVar1 = wasm::Type::operator==((Type *)&this_local,&local_4c);
      local_62 = true;
      if (!bVar1) {
        local_62 = wasm::Type::isSubType((Type)(local_48->ref->type).id,(Type)this_local);
      }
      if (local_62 == false) {
        return;
      }
      *(Expression **)&(as->super_SpecificExpression<(wasm::Expression::Id)81>).super_Expression =
           local_48->ref;
    }
  }
  return;
}

Assistant:

void skipCast(Expression*& input, Type requiredType = Type::none) {
    // Traps-never-happen mode is a requirement for us to optimize here.
    if (!getPassOptions().trapsNeverHappen) {
      return;
    }
    while (1) {
      if (auto* as = input->dynCast<RefAs>()) {
        if (requiredType == Type::none ||
            Type::isSubType(as->value->type, requiredType)) {
          input = as->value;
          continue;
        }
      } else if (auto* cast = input->dynCast<RefCast>()) {
        if (requiredType == Type::none ||
            Type::isSubType(cast->ref->type, requiredType)) {
          input = cast->ref;
          continue;
        }
      }
      break;
    }
  }